

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_io.c
# Opt level: O0

int ARKStepSetDeltaGammaMax(void *arkode_mem,realtype dgmax)

{
  double in_XMM0_Qa;
  int retval;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeMem *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  void *in_stack_ffffffffffffffd8;
  undefined4 local_4;
  
  local_4 = arkStep_AccessStepMem
                      (in_stack_ffffffffffffffd8,
                       (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffc8,(ARKodeARKStepMem *)0xe87c5a);
  if (local_4 == 0) {
    if (0.0 < in_XMM0_Qa) {
      *(double *)((long)in_stack_ffffffffffffffd8 + 0xa8) = in_XMM0_Qa;
    }
    else {
      *(undefined8 *)((long)in_stack_ffffffffffffffd8 + 0xa8) = 0x3fc999999999999a;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int ARKStepSetDeltaGammaMax(void *arkode_mem, realtype dgmax)
{
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  int retval;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(arkode_mem, "ARKStepSetDeltaGammaMax",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* if argument legal set it, otherwise set default */
  if (dgmax <= ZERO) {
    step_mem->dgmax = DGMAX;
  } else {
    step_mem->dgmax = dgmax;
  }

  return(ARK_SUCCESS);
}